

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void Excel::Parser::loadWorkSheets
               (vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *boundSheets,
               Stream *stream,IStorage *storage)

{
  pointer pBVar1;
  size_t i;
  ulong sheetIdx;
  long lVar2;
  
  lVar2 = 8;
  for (sheetIdx = 0;
      pBVar1 = (boundSheets->
               super__Vector_base<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>)._M_impl.
               super__Vector_impl_data._M_start,
      sheetIdx <
      (ulong)(((long)(boundSheets->
                     super__Vector_base<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x28);
      sheetIdx = sheetIdx + 1) {
    if (*(int *)((long)pBVar1 + lVar2 + -4) == 0) {
      (*storage->_vptr_IStorage[4])(storage,sheetIdx,(long)&pBVar1->m_BOFPosition + lVar2);
      loadSheet(sheetIdx,(BoundSheet *)
                         ((long)(boundSheets->
                                super__Vector_base<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar2 + -8),stream,
                storage);
    }
    lVar2 = lVar2 + 0x28;
  }
  return;
}

Assistant:

inline void
Parser::loadWorkSheets( const std::vector< BoundSheet > & boundSheets,
	Stream & stream, IStorage& storage )
{
	for( size_t i = 0; i < boundSheets.size(); ++i )
	{
		if( boundSheets[i].sheetType() == BoundSheet::WorkSheet )
		{
			storage.onSheet( i, boundSheets[i].sheetName() );
			loadSheet( i, boundSheets[i], stream, storage );
		}
	}
}